

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::hyperChooseColumn(HEkkPrimal *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  const_reference pvVar7;
  HighsInt *pHVar8;
  reference pvVar9;
  const_reference pvVar10;
  reference pvVar11;
  double *pdVar12;
  vector<double,_std::allocator<double>_> *this_00;
  long *in_RDI;
  double dual_infeasibility;
  HighsInt iCol;
  HighsInt iEntry;
  bool consider_nonbasic_free_column;
  double best_measure;
  vector<double,_std::allocator<double>_> *workDual;
  vector<signed_char,_std::allocator<signed_char>_> *nonbasicFlag;
  vector<signed_char,_std::allocator<signed_char>_> *nonbasicMove;
  double in_stack_ffffffffffffffa0;
  HSet *in_stack_ffffffffffffffa8;
  HighsSimplexAnalysis *in_stack_ffffffffffffffb0;
  double local_40;
  int local_30;
  double local_28;
  
  if (((*(byte *)(in_RDI + 0x2a) & 1) != 0) && ((*(byte *)((long)in_RDI + 0x151) & 1) == 0)) {
    HighsSimplexAnalysis::simplexTimerStart
              (in_stack_ffffffffffffffb0,(HighsInt)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
               (HighsInt)in_stack_ffffffffffffffa8);
    lVar4 = *in_RDI;
    lVar5 = *in_RDI;
    this_00 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0x2578);
    if ((*(byte *)((long)in_RDI + 500) & 1) != 0) {
      printf("H-S  CHUZC: Max changed measure is %9.4g for column %4d",in_RDI[0x3d],
             (ulong)*(uint *)(in_RDI + 0x3e));
    }
    local_28 = (double)in_RDI[0x3d];
    *(undefined4 *)((long)in_RDI + 0x44) = 0xffffffff;
    if (-1 < (int)in_RDI[0x3e]) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (this_00,(long)(int)in_RDI[0x3e]);
      if ((*pvVar7 != 0.0) || (NAN(*pvVar7))) {
        *(int *)((long)in_RDI + 0x44) = (int)in_RDI[0x3e];
      }
    }
    pHVar8 = HSet::count((HSet *)(in_RDI + 0x20));
    iVar2 = *pHVar8;
    if ((int)in_RDI[0x2b] != 0) {
      for (local_30 = 1; local_30 <= (int)in_RDI[0x2b]; local_30 = local_30 + 1) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2c),(long)local_30);
        iVar3 = *pvVar9;
        pvVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                            ((vector<signed_char,_std::allocator<signed_char>_> *)(lVar5 + 0x2990),
                             (long)iVar3);
        if (*pvVar10 != '\0') {
          pvVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                              ((vector<signed_char,_std::allocator<signed_char>_> *)(lVar4 + 0x29a8)
                               ,(long)iVar3);
          in_stack_ffffffffffffffb0 = (HighsSimplexAnalysis *)(double)-(int)*pvVar10;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar3);
          local_40 = (double)in_stack_ffffffffffffffb0 * *pvVar7;
          if ((iVar2 != 0) &&
             (bVar6 = HSet::in(in_stack_ffffffffffffffa8,
                               (HighsInt)((ulong)in_stack_ffffffffffffffa0 >> 0x20)), bVar6)) {
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar3);
            local_40 = ABS(*pvVar7);
          }
          if ((double)in_RDI[6] <= local_40 && local_40 != (double)in_RDI[6]) {
            in_stack_ffffffffffffffa8 = (HSet *)(local_40 * local_40);
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),
                                 (long)iVar3);
            in_stack_ffffffffffffffa0 = local_28;
            if (local_28 * *pvVar11 < (double)in_stack_ffffffffffffffa8) {
              pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),
                                   (long)iVar3);
              dVar1 = *pvVar11;
              *(int *)((long)in_RDI + 0x44) = iVar3;
              local_28 = (local_40 * local_40) / dVar1;
            }
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + 0x44) != (int)in_RDI[0x3e]) {
      if ((*(byte *)((long)in_RDI + 500) & 1) != 0) {
        printf(", and after HS CHUZC set it is now %9.4g for column %4d",local_28,
               (ulong)*(uint *)((long)in_RDI + 0x44));
      }
      pdVar12 = std::max<double>((double *)(in_RDI + 0x3d),(double *)(in_RDI + 0x3c));
      in_RDI[0x3c] = (long)*pdVar12;
    }
    if (local_28 < (double)in_RDI[0x3c]) {
      *(undefined1 *)((long)in_RDI + 0x152) = 0;
      *(undefined1 *)((long)in_RDI + 0x151) = 1;
      if ((*(byte *)((long)in_RDI + 500) & 1) != 0) {
        printf(", but some may have measure >= %9.4g\n",in_RDI[0x3c]);
      }
    }
    else {
      *(undefined1 *)((long)in_RDI + 0x152) = 1;
      if ((*(byte *)((long)in_RDI + 500) & 1) != 0) {
        printf(", and no       has  measure >  %9.4g\n",in_RDI[0x3c]);
      }
    }
    HighsSimplexAnalysis::simplexTimerStop
              (in_stack_ffffffffffffffb0,(HighsInt)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
               (HighsInt)in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

void HEkkPrimal::hyperChooseColumn() {
  if (!use_hyper_chuzc) return;
  if (initialise_hyper_chuzc) return;
  analysis->simplexTimerStart(ChuzcHyperClock);
  const vector<int8_t>& nonbasicMove = ekk_instance_.basis_.nonbasicMove_;
  const vector<int8_t>& nonbasicFlag = ekk_instance_.basis_.nonbasicFlag_;
  const vector<double>& workDual = ekk_instance_.info_.workDual_;
  if (report_hyper_chuzc)
    printf(
        "H-S  CHUZC: Max changed measure is %9.4g for column %4" HIGHSINT_FORMAT
        "",
        max_changed_measure_value, max_changed_measure_column);
  double best_measure = max_changed_measure_value;
  variable_in = -1;
  if (max_changed_measure_column >= 0) {
    // Use max_changed_measure_column if it is well defined and has
    // nonzero dual. It may have been zeroed because it is taboo
    if (workDual[max_changed_measure_column])
      variable_in = max_changed_measure_column;
  }
  const bool consider_nonbasic_free_column =
      (nonbasic_free_col_set.count() != 0);
  if (num_hyper_chuzc_candidates) {
    for (HighsInt iEntry = 1; iEntry <= num_hyper_chuzc_candidates; iEntry++) {
      HighsInt iCol = hyper_chuzc_candidate[iEntry];
      if (nonbasicFlag[iCol] == kNonbasicFlagFalse) {
        assert(!nonbasicMove[iCol]);
        continue;
      }
      // Assess any dual infeasibility
      double dual_infeasibility = -nonbasicMove[iCol] * workDual[iCol];
      if (consider_nonbasic_free_column) {
        if (nonbasic_free_col_set.in(iCol))
          dual_infeasibility = fabs(workDual[iCol]);
      }
      if (dual_infeasibility > dual_feasibility_tolerance) {
        if (dual_infeasibility * dual_infeasibility >
            best_measure * edge_weight_[iCol]) {
          best_measure =
              dual_infeasibility * dual_infeasibility / edge_weight_[iCol];
          variable_in = iCol;
        }
      }
    }
  }
  if (variable_in != max_changed_measure_column) {
    if (report_hyper_chuzc)
      printf(
          ", and after HS CHUZC set it is now %9.4g for column "
          "%4" HIGHSINT_FORMAT "",
          best_measure, variable_in);
    max_hyper_chuzc_non_candidate_measure =
        max(max_changed_measure_value, max_hyper_chuzc_non_candidate_measure);
  }
  if (best_measure >= max_hyper_chuzc_non_candidate_measure) {
    // Candidate is at least as good as any unknown column, so accept it
    done_next_chuzc = true;
    if (report_hyper_chuzc)
      printf(", and no       has  measure >  %9.4g\n",
             max_hyper_chuzc_non_candidate_measure);
  } else {
    // Candidate isn't as good as best unknown column, so do a full CHUZC
    // Shouldn't claim to have done the next CHUZC
    assert(!done_next_chuzc);
    done_next_chuzc = false;
    initialise_hyper_chuzc = true;
    if (report_hyper_chuzc)
      printf(", but some may have measure >= %9.4g\n",
             max_hyper_chuzc_non_candidate_measure);
  }
  analysis->simplexTimerStop(ChuzcHyperClock);
}